

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O0

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
               (Op op,SquareMatrix<std::complex<float>_> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  complex<float> *pcVar3;
  complex<float> *__b;
  _ComplexT_conflict extraout_XMM0_Qa;
  long local_50;
  int64_t i_1;
  int64_t j_1;
  long local_38;
  int64_t i;
  int64_t j;
  int64_t cols;
  int64_t rows;
  SquareMatrix<std::complex<float>_> *A_local;
  Op op_local;
  
  if (op != NoTrans) {
    iVar1 = SquareMatrix<std::complex<float>_>::rows(A);
    iVar2 = SquareMatrix<std::complex<float>_>::cols(A);
    if (op == ConjTrans) {
      for (i = 0; i < iVar2; i = i + 1) {
        for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
          pcVar3 = SquareMatrix<std::complex<float>_>::operator()(A,local_38,i);
          std::conj<float>(pcVar3);
          pcVar3 = SquareMatrix<std::complex<float>_>::operator()(A,local_38,i);
          pcVar3->_M_value = extraout_XMM0_Qa;
        }
      }
    }
    for (i_1 = 0; local_50 = i_1, i_1 < iVar2 + -1; i_1 = i_1 + 1) {
      while (local_50 = local_50 + 1, local_50 < iVar1) {
        pcVar3 = SquareMatrix<std::complex<float>_>::operator()(A,local_50,i_1);
        __b = SquareMatrix<std::complex<float>_>::operator()(A,i_1,local_50);
        std::swap<std::complex<float>>(pcVar3,__b);
      }
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }